

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O0

bool __thiscall
tonk::OutgoingQueue::Append
          (OutgoingQueue *this,uint messageType,uint8_t *messageData,uint messageBytes)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  ushort *puVar4;
  uint in_ECX;
  void *in_RDX;
  short in_SI;
  long *in_RDI;
  uint8_t *messagePtr;
  uint nextWriteOffset;
  uint writeBytes;
  OutgoingQueuedDatagram *datagram;
  uint headerWord;
  bool local_25;
  
  lVar2 = in_RDI[1];
  if (lVar2 == 0) {
    local_25 = false;
  }
  else {
    iVar3 = in_ECX + 2;
    uVar1 = *(uint *)(lVar2 + 8);
    if (*(uint *)(*in_RDI + 0x1f0) < uVar1 + iVar3) {
      local_25 = false;
    }
    else {
      puVar4 = (ushort *)(lVar2 + 0x10 + (ulong)uVar1);
      *puVar4 = in_SI << 0xb | (ushort)in_ECX;
      memcpy(puVar4 + 1,in_RDX,(ulong)in_ECX);
      *(uint *)(lVar2 + 8) = uVar1 + iVar3;
      *(int *)(in_RDI + 4) = iVar3 + (int)in_RDI[4];
      local_25 = true;
    }
  }
  return local_25;
}

Assistant:

bool OutgoingQueue::Append(
    unsigned messageType,
    const uint8_t* messageData,
    unsigned messageBytes)
{
    TONK_VERBOSE_OUTGOING_LOG("OutgoingQueue::Append messageType=", messageType,
        " messageBytes=", messageBytes, " OutBuffer=", OutBuffer);

    OutgoingQueuedDatagram* datagram = OutBuffer;
    if (!datagram)
    {
        TONK_VERBOSE_OUTGOING_LOG("Append: OutBuffer is null - abort");
        return false;
    }

    const unsigned writeBytes = static_cast<unsigned>(
        protocol::kMessageFrameBytes + messageBytes);
    const unsigned nextWriteOffset = datagram->NextWriteOffset;

    if (nextWriteOffset + writeBytes > Common->MaxMessageSectionBytes)
    {
        TONK_VERBOSE_OUTGOING_LOG("Append: nextWriteOffset=", nextWriteOffset,
            " + writeBytes=", writeBytes, " > ", Common->MaxMessageSectionBytes);
        return false;
    }

    uint8_t* messagePtr = datagram->Data + nextWriteOffset;

    // Write 2-byte message frame header
    protocol::WriteMessageFrameHeader(messagePtr, messageType, messageBytes);

    // Copy message into place
    memcpy(messagePtr + protocol::kMessageFrameBytes, messageData, messageBytes);

    // Record that the data was written
    datagram->NextWriteOffset = nextWriteOffset + writeBytes;

    // Update queued bytes
    QueuedBytes += writeBytes;

    TONK_VERBOSE_OUTGOING_LOG("Append: WROTE TO DATAGRAM datagram->NextWriteOffset=",
        datagram->NextWriteOffset, " + writeBytes=", writeBytes, " MaxMessageSectionBytes=",
        Common->MaxMessageSectionBytes, " QueuedBytes=", QueuedBytes);

#ifdef TONK_DETAILED_STATS
    datagram->AddMessageStats(messageType, messageBytes);
#endif // TONK_DETAILED_STATS

    return true;
}